

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool conn_maxage(Curl_easy *data,connectdata *conn,curltime now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  timediff_t tVar3;
  curltime newer;
  curltime older;
  timediff_t idletime;
  connectdata *conn_local;
  Curl_easy *data_local;
  curltime now_local;
  
  if (conn->data == (Curl_easy *)0x0) {
    uVar1 = (conn->lastused).tv_sec;
    uVar2 = (conn->lastused).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(now._0_12_,0);
    newer.tv_usec = SUB124(now._0_12_,8);
    older._12_4_ = 0;
    tVar3 = Curl_timediff(newer,older);
    if ((data->set).maxage_conn < (tVar3 / 1000) / 1000) {
      Curl_infof(data,"Too old connection (%ld seconds), disconnect it\n",tVar3 / 1000);
      return true;
    }
  }
  return false;
}

Assistant:

static bool conn_maxage(struct Curl_easy *data,
                        struct connectdata *conn,
                        struct curltime now)
{
  if(!conn->data) {
    timediff_t idletime = Curl_timediff(now, conn->lastused);
    idletime /= 1000; /* integer seconds is fine */

    if(idletime/1000 > data->set.maxage_conn) {
      infof(data, "Too old connection (%ld seconds), disconnect it\n",
            idletime);
      return TRUE;
    }
  }
  return FALSE;
}